

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_binbuf.c
# Opt level: O0

int binbuf_read(_binbuf *b,char *filename,char *dirname,int crflag)

{
  uint __fd;
  size_t nbytes;
  __off_t _Var1;
  char *text;
  ulong uVar2;
  int local_43c;
  char local_438 [4];
  int i;
  char namebuf [1000];
  char *buf;
  int readret;
  int fd;
  long length;
  int crflag_local;
  char *dirname_local;
  char *filename_local;
  _binbuf *b_local;
  
  if (*dirname == '\0') {
    snprintf(local_438,999,"%s",filename);
  }
  else {
    snprintf(local_438,999,"%s/%s",dirname,filename);
  }
  namebuf[0x3df] = '\0';
  __fd = sys_open(local_438,0);
  if ((int)__fd < 0) {
    fprintf(_stderr,"open: ");
    perror(local_438);
    b_local._4_4_ = 1;
  }
  else {
    nbytes = lseek(__fd,0,2);
    if ((((long)nbytes < 0) || (_Var1 = lseek(__fd,0,0), _Var1 < 0)) ||
       (text = (char *)getbytes(nbytes), text == (char *)0x0)) {
      fprintf(_stderr,"lseek: ");
      perror(local_438);
      close(__fd);
      b_local._4_4_ = 1;
    }
    else {
      uVar2 = read(__fd,text,nbytes);
      if ((long)(int)uVar2 < (long)nbytes) {
        fprintf(_stderr,"read (%d %ld) -> %d\n",(ulong)__fd,nbytes,uVar2 & 0xffffffff);
        perror(local_438);
        close(__fd);
        freebytes(text,nbytes);
        b_local._4_4_ = 1;
      }
      else {
        if (crflag != 0) {
          for (local_43c = 0; (long)local_43c < (long)nbytes; local_43c = local_43c + 1) {
            if (text[local_43c] == '\n') {
              text[local_43c] = ';';
            }
          }
        }
        binbuf_text(b,text,nbytes);
        freebytes(text,nbytes);
        close(__fd);
        b_local._4_4_ = 0;
      }
    }
  }
  return b_local._4_4_;
}

Assistant:

int binbuf_read(t_binbuf *b, const char *filename, const char *dirname, int crflag)
{
    long length;
    int fd;
    int readret;
    char *buf;
    char namebuf[MAXPDSTRING];

    if (*dirname)
        snprintf(namebuf, MAXPDSTRING-1, "%s/%s", dirname, filename);
    else
        snprintf(namebuf, MAXPDSTRING-1, "%s", filename);
    namebuf[MAXPDSTRING-1] = 0;

    if ((fd = sys_open(namebuf, 0)) < 0)
    {
        fprintf(stderr, "open: ");
        perror(namebuf);
        return (1);
    }
    if ((length = (long)lseek(fd, 0, SEEK_END)) < 0 || lseek(fd, 0, SEEK_SET) < 0
        || !(buf = t_getbytes(length)))
    {
        fprintf(stderr, "lseek: ");
        perror(namebuf);
        close(fd);
        return(1);
    }
    if ((readret = (int)read(fd, buf, length)) < length)
    {
        fprintf(stderr, "read (%d %ld) -> %d\n", fd, length, readret);
        perror(namebuf);
        close(fd);
        t_freebytes(buf, length);
        return(1);
    }
        /* optionally map carriage return to semicolon */
    if (crflag)
    {
        int i;
        for (i = 0; i < length; i++)
            if (buf[i] == '\n')
                buf[i] = ';';
    }
    binbuf_text(b, buf, length);

#if 0
    startpost("binbuf_read "); postatom(b->b_n, b->b_vec); endpost();
#endif

    t_freebytes(buf, length);
    close(fd);
    return (0);
}